

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_replay.cpp
# Opt level: O1

void __thiscall
ThreadedReplayer::mark_currently_active_modules
          (ThreadedReplayer *this,VkPipelineShaderStageCreateInfo *stages,uint32_t count)

{
  uint uVar1;
  pointer pPVar2;
  mapped_type *pmVar3;
  VkShaderModule *ppVVar4;
  ulong uVar5;
  long in_FS_OFFSET;
  VkShaderModule module;
  VkShaderModule local_38;
  
  if (this->robustness == true) {
    uVar1 = *(uint *)(in_FS_OFFSET + -0x18);
    pPVar2 = (this->per_thread_data).
             super__Vector_base<ThreadedReplayer::PerThreadData,_std::allocator<ThreadedReplayer::PerThreadData>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pPVar2[uVar1].num_failed_module_hashes = count;
    if (count != 0) {
      ppVVar4 = &stages->module;
      uVar5 = 0;
      do {
        local_38 = *ppVVar4;
        pmVar3 = std::__detail::
                 _Map_base<VkShaderModule_T_*,_std::pair<VkShaderModule_T_*const,_unsigned_long>,_std::allocator<std::pair<VkShaderModule_T_*const,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<VkShaderModule_T_*>,_std::hash<VkShaderModule_T_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 ::operator[]((_Map_base<VkShaderModule_T_*,_std::pair<VkShaderModule_T_*const,_unsigned_long>,_std::allocator<std::pair<VkShaderModule_T_*const,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<VkShaderModule_T_*>,_std::hash<VkShaderModule_T_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                               *)&this->shader_module_to_hash,&local_38);
        pPVar2[uVar1].failed_module_hashes[uVar5] = *pmVar3;
        uVar5 = uVar5 + 1;
        ppVVar4 = ppVVar4 + 6;
      } while (count != uVar5);
    }
  }
  return;
}

Assistant:

void mark_currently_active_modules(const VkPipelineShaderStageCreateInfo *stages, uint32_t count)
	{
		if (robustness)
		{
			auto &per_thread = get_per_thread_data();
			per_thread.num_failed_module_hashes = count;
			for (unsigned i = 0; i < count; i++)
			{
				VkShaderModule module = stages[i].module;
				per_thread.failed_module_hashes[i] = shader_module_to_hash[module];
			}
		}
	}